

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxerutil.cc
# Opt level: O0

uint64 mkvmuxer::anon_unknown_0::WriteBlock
                 (IMkvWriter *writer,Frame *frame,int64 timecode,uint64 timecode_scale)

{
  bool bVar1;
  int32 iVar2;
  int iVar3;
  uint8_t *puVar4;
  uint64 uVar5;
  uint64 uVar6;
  uint64 uVar7;
  uint64 uVar8;
  int64_t iVar9;
  uint64_t uVar10;
  uint64_t uVar11;
  uint64_t uVar12;
  ulong in_RCX;
  Frame *in_RSI;
  IMkvWriter *in_RDI;
  uint64 block_group_payload_size;
  uint64 block_elem_size;
  uint64 block_payload_size;
  uint64 block_duration_elem_size;
  uint64 duration;
  uint64 reference_block_elem_size;
  uint64 reference_block_timestamp;
  uint64 discard_padding_elem_size;
  uint64 block_additions_elem_size;
  uint64 block_additions_payload_size;
  uint64 block_more_elem_size;
  uint64 block_more_payload_size;
  uint64 block_addid_elem_size;
  uint64 block_additional_elem_size;
  IMkvWriter *in_stack_ffffffffffffff28;
  IMkvWriter *in_stack_ffffffffffffff30;
  IMkvWriter *in_stack_ffffffffffffff38;
  int64 in_stack_ffffffffffffff40;
  IMkvWriter *in_stack_ffffffffffffff48;
  IMkvWriter *pIVar13;
  uint64 local_80;
  uint64 local_70;
  uint64 local_60;
  long local_58;
  uint64 local_8;
  
  local_58 = 0;
  puVar4 = Frame::additional(in_RSI);
  if (puVar4 != (uint8_t *)0x0) {
    Frame::additional(in_RSI);
    Frame::additional_length(in_RSI);
    uVar5 = EbmlElementSize((uint64)in_stack_ffffffffffffff38,(uint8 *)in_stack_ffffffffffffff30,
                            (uint64)in_stack_ffffffffffffff28);
    Frame::add_id(in_RSI);
    uVar6 = EbmlElementSize((uint64)in_stack_ffffffffffffff30,(uint64)in_stack_ffffffffffffff28);
    uVar7 = EbmlMasterElementSize
                      ((uint64)in_stack_ffffffffffffff30,(uint64)in_stack_ffffffffffffff28);
    uVar8 = EbmlMasterElementSize
                      ((uint64)in_stack_ffffffffffffff30,(uint64)in_stack_ffffffffffffff28);
    local_58 = uVar8 + uVar7 + uVar6 + uVar5;
  }
  local_60 = 0;
  iVar9 = Frame::discard_padding(in_RSI);
  if (iVar9 != 0) {
    Frame::discard_padding(in_RSI);
    local_60 = EbmlElementSize((uint64)in_stack_ffffffffffffff30,(int64)in_stack_ffffffffffffff28);
  }
  Frame::reference_block_timestamp(in_RSI);
  local_70 = 0;
  bVar1 = Frame::is_key(in_RSI);
  if (!bVar1) {
    local_70 = EbmlElementSize((uint64)in_stack_ffffffffffffff30,(uint64)in_stack_ffffffffffffff28);
  }
  uVar10 = Frame::duration(in_RSI);
  local_80 = 0;
  if (uVar10 / in_RCX != 0) {
    local_80 = EbmlElementSize((uint64)in_stack_ffffffffffffff30,(uint64)in_stack_ffffffffffffff28);
  }
  uVar11 = Frame::length(in_RSI);
  uVar5 = EbmlMasterElementSize((uint64)in_stack_ffffffffffffff30,(uint64)in_stack_ffffffffffffff28)
  ;
  bVar1 = WriteEbmlMasterElement
                    (in_stack_ffffffffffffff38,(uint64)in_stack_ffffffffffffff30,
                     (uint64)in_stack_ffffffffffffff28);
  if (bVar1) {
    bVar1 = WriteEbmlMasterElement
                      (in_stack_ffffffffffffff38,(uint64)in_stack_ffffffffffffff30,
                       (uint64)in_stack_ffffffffffffff28);
    if (bVar1) {
      Frame::track_number(in_RSI);
      iVar2 = WriteUInt(in_stack_ffffffffffffff38,(uint64)in_stack_ffffffffffffff30);
      if (iVar2 == 0) {
        iVar2 = SerializeInt(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
                             (int32)((ulong)in_stack_ffffffffffffff38 >> 0x20));
        if (iVar2 == 0) {
          iVar2 = SerializeInt(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
                               (int32)((ulong)in_stack_ffffffffffffff38 >> 0x20));
          if (iVar2 == 0) {
            pIVar13 = in_RDI;
            puVar4 = Frame::frame(in_RSI);
            uVar12 = Frame::length(in_RSI);
            iVar3 = (**pIVar13->_vptr_IMkvWriter)(pIVar13,puVar4,uVar12 & 0xffffffff);
            if (iVar3 == 0) {
              puVar4 = Frame::additional(in_RSI);
              if (puVar4 != (uint8_t *)0x0) {
                bVar1 = WriteEbmlMasterElement
                                  (in_stack_ffffffffffffff38,(uint64)in_stack_ffffffffffffff30,
                                   (uint64)in_stack_ffffffffffffff28);
                if (!bVar1) {
                  return 0;
                }
                bVar1 = WriteEbmlMasterElement
                                  (in_stack_ffffffffffffff38,(uint64)in_stack_ffffffffffffff30,
                                   (uint64)in_stack_ffffffffffffff28);
                if (!bVar1) {
                  return 0;
                }
                Frame::add_id(in_RSI);
                bVar1 = WriteEbmlElement(in_stack_ffffffffffffff30,(uint64)in_stack_ffffffffffffff28
                                         ,0x18b54c);
                if (!bVar1) {
                  return 0;
                }
                in_stack_ffffffffffffff30 = in_RDI;
                in_stack_ffffffffffffff38 = (IMkvWriter *)Frame::additional(in_RSI);
                Frame::additional_length(in_RSI);
                bVar1 = WriteEbmlElement(in_stack_ffffffffffffff38,(uint64)in_stack_ffffffffffffff30
                                         ,(uint8 *)in_stack_ffffffffffffff28,0x18b5a4);
                if (!bVar1) {
                  return 0;
                }
              }
              iVar9 = Frame::discard_padding(in_RSI);
              if (iVar9 != 0) {
                Frame::discard_padding(in_RSI);
                bVar1 = WriteEbmlElement(in_stack_ffffffffffffff38,(uint64)in_stack_ffffffffffffff30
                                         ,(int64)in_RDI);
                in_stack_ffffffffffffff28 = in_RDI;
                if (!bVar1) {
                  return 0;
                }
              }
              bVar1 = Frame::is_key(in_RSI);
              if ((bVar1) ||
                 (bVar1 = WriteEbmlElement(in_stack_ffffffffffffff30,
                                           (uint64)in_stack_ffffffffffffff28,0x18b635), bVar1)) {
                if ((uVar10 / in_RCX == 0) ||
                   (bVar1 = WriteEbmlElement(in_stack_ffffffffffffff30,
                                             (uint64)in_stack_ffffffffffffff28,0x18b666), bVar1)) {
                  local_8 = EbmlMasterElementSize
                                      ((uint64)in_stack_ffffffffffffff30,
                                       (uint64)in_stack_ffffffffffffff28);
                  local_8 = local_8 + uVar5 + uVar11 + 4 + local_58 + local_80 + local_60 + local_70
                  ;
                }
                else {
                  local_8 = 0;
                }
              }
              else {
                local_8 = 0;
              }
            }
            else {
              local_8 = 0;
            }
          }
          else {
            local_8 = 0;
          }
        }
        else {
          local_8 = 0;
        }
      }
      else {
        local_8 = 0;
      }
    }
    else {
      local_8 = 0;
    }
  }
  else {
    local_8 = 0;
  }
  return local_8;
}

Assistant:

uint64 WriteBlock(IMkvWriter* writer, const Frame* const frame, int64 timecode,
                  uint64 timecode_scale) {
  uint64 block_additional_elem_size = 0;
  uint64 block_addid_elem_size = 0;
  uint64 block_more_payload_size = 0;
  uint64 block_more_elem_size = 0;
  uint64 block_additions_payload_size = 0;
  uint64 block_additions_elem_size = 0;
  if (frame->additional()) {
    block_additional_elem_size =
        EbmlElementSize(libwebm::kMkvBlockAdditional, frame->additional(),
                        frame->additional_length());
    block_addid_elem_size = EbmlElementSize(
        libwebm::kMkvBlockAddID, static_cast<uint64>(frame->add_id()));

    block_more_payload_size =
        block_addid_elem_size + block_additional_elem_size;
    block_more_elem_size =
        EbmlMasterElementSize(libwebm::kMkvBlockMore, block_more_payload_size) +
        block_more_payload_size;
    block_additions_payload_size = block_more_elem_size;
    block_additions_elem_size =
        EbmlMasterElementSize(libwebm::kMkvBlockAdditions,
                              block_additions_payload_size) +
        block_additions_payload_size;
  }

  uint64 discard_padding_elem_size = 0;
  if (frame->discard_padding() != 0) {
    discard_padding_elem_size =
        EbmlElementSize(libwebm::kMkvDiscardPadding,
                        static_cast<int64>(frame->discard_padding()));
  }

  const uint64 reference_block_timestamp =
      frame->reference_block_timestamp() / timecode_scale;
  uint64 reference_block_elem_size = 0;
  if (!frame->is_key()) {
    reference_block_elem_size =
        EbmlElementSize(libwebm::kMkvReferenceBlock, reference_block_timestamp);
  }

  const uint64 duration = frame->duration() / timecode_scale;
  uint64 block_duration_elem_size = 0;
  if (duration > 0)
    block_duration_elem_size =
        EbmlElementSize(libwebm::kMkvBlockDuration, duration);

  const uint64 block_payload_size = 4 + frame->length();
  const uint64 block_elem_size =
      EbmlMasterElementSize(libwebm::kMkvBlock, block_payload_size) +
      block_payload_size;

  const uint64 block_group_payload_size =
      block_elem_size + block_additions_elem_size + block_duration_elem_size +
      discard_padding_elem_size + reference_block_elem_size;

  if (!WriteEbmlMasterElement(writer, libwebm::kMkvBlockGroup,
                              block_group_payload_size)) {
    return 0;
  }

  if (!WriteEbmlMasterElement(writer, libwebm::kMkvBlock, block_payload_size))
    return 0;

  if (WriteUInt(writer, frame->track_number()))
    return 0;

  if (SerializeInt(writer, timecode, 2))
    return 0;

  // For a Block, flags is always 0.
  if (SerializeInt(writer, 0, 1))
    return 0;

  if (writer->Write(frame->frame(), static_cast<uint32>(frame->length())))
    return 0;

  if (frame->additional()) {
    if (!WriteEbmlMasterElement(writer, libwebm::kMkvBlockAdditions,
                                block_additions_payload_size)) {
      return 0;
    }

    if (!WriteEbmlMasterElement(writer, libwebm::kMkvBlockMore,
                                block_more_payload_size))
      return 0;

    if (!WriteEbmlElement(writer, libwebm::kMkvBlockAddID,
                          static_cast<uint64>(frame->add_id())))
      return 0;

    if (!WriteEbmlElement(writer, libwebm::kMkvBlockAdditional,
                          frame->additional(), frame->additional_length())) {
      return 0;
    }
  }

  if (frame->discard_padding() != 0 &&
      !WriteEbmlElement(writer, libwebm::kMkvDiscardPadding,
                        static_cast<int64>(frame->discard_padding()))) {
    return false;
  }

  if (!frame->is_key() && !WriteEbmlElement(writer, libwebm::kMkvReferenceBlock,
                                            reference_block_timestamp)) {
    return false;
  }

  if (duration > 0 &&
      !WriteEbmlElement(writer, libwebm::kMkvBlockDuration, duration)) {
    return false;
  }
  return EbmlMasterElementSize(libwebm::kMkvBlockGroup,
                               block_group_payload_size) +
         block_group_payload_size;
}